

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O1

MppBuffer h264e_vepu_buf_get_frame_buffer(HalH264eVepuBufs *bufs,RK_S32 index)

{
  MppBuffer buf;
  MppBuffer local_28;
  
  local_28 = bufs->frm_buf[index];
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter\n","h264e_vepu_buf_get_frame_buffer",bufs);
  }
  if (local_28 == (MppBuffer)0x0) {
    mpp_buffer_get_with_tag
              (bufs->group,&local_28,bufs->frm_size,"hal_h264e_vepu_v2",
               "h264e_vepu_buf_get_frame_buffer");
    if (local_28 == (MppBuffer)0x0) {
      _mpp_log_l(2,"hal_h264e_vepu_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"buf",
                 "h264e_vepu_buf_get_frame_buffer",0x125);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
    bufs->frm_buf[index] = local_28;
    bufs->frm_cnt = bufs->frm_cnt + 1;
  }
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave %p\n","h264e_vepu_buf_get_frame_buffer",bufs);
  }
  return local_28;
}

Assistant:

MppBuffer h264e_vepu_buf_get_frame_buffer(HalH264eVepuBufs *bufs, RK_S32 index)
{
    MppBuffer buf = bufs->frm_buf[index];

    hal_h264e_dbg_buffer("enter\n", bufs);

    if (NULL == buf) {
        mpp_buffer_get(bufs->group, &buf, bufs->frm_size);
        mpp_assert(buf);
        bufs->frm_buf[index] = buf;
        bufs->frm_cnt++;
    }

    hal_h264e_dbg_buffer("leave %p\n", bufs);

    return buf;
}